

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PretransformVertices.cpp
# Opt level: O0

void __thiscall
Assimp::PretransformVertices::CollectData
          (PretransformVertices *this,aiScene *pcScene,aiNode *pcNode,uint iMat,uint iVFormat,
          aiMesh *pcMeshOut,uint *aiCurrent,uint *num_refs)

{
  aiMesh *pcMesh_00;
  float fVar1;
  bool bVar2;
  uint uVar3;
  uint *puVar4;
  aiVector3D *paVar5;
  aiMatrix4x4t<float> *this_00;
  aiVector3t<float> *paVar6;
  aiFace *paVar7;
  aiFace *paVar8;
  ulong uVar9;
  uint *puVar10;
  aiVector3t<float> aVar11;
  uint local_164;
  uint local_160;
  uint i_1;
  uint hahn_1;
  uint hahn;
  uint *pi;
  uint num_idx;
  aiFace *f_dst;
  aiFace *f_src;
  uint planck;
  uint p;
  float local_128;
  aiVector3t<float> local_11c;
  aiVector3t<float> local_110;
  aiVector3t<float> local_100;
  uint local_f4;
  float fStack_f0;
  uint n_2;
  float local_e8;
  aiVector3t<float> local_dc;
  uint local_d0;
  undefined1 local_cc [4];
  uint n_1;
  aiMatrix3x3 m;
  aiMatrix4x4 mWorldIT;
  float local_60;
  uint local_4c;
  uint n;
  uint *num_ref;
  aiMesh *pcMesh;
  uint i;
  bool identity;
  aiMesh *pcMeshOut_local;
  uint iVFormat_local;
  uint iMat_local;
  aiNode *pcNode_local;
  aiScene *pcScene_local;
  PretransformVertices *this_local;
  
  bVar2 = aiMatrix4x4t<float>::IsIdentity(&pcNode->mTransformation);
  pcMesh._0_4_ = 0;
  do {
    if (pcNode->mNumMeshes <= (uint)pcMesh) {
      for (local_164 = 0; local_164 < pcNode->mNumChildren; local_164 = local_164 + 1) {
        CollectData(this,pcScene,pcNode->mChildren[local_164],iMat,iVFormat,pcMeshOut,aiCurrent,
                    num_refs);
      }
      return;
    }
    pcMesh_00 = pcScene->mMeshes[pcNode->mMeshes[(uint)pcMesh]];
    if ((iMat == pcMesh_00->mMaterialIndex) &&
       (uVar3 = GetMeshVFormat(this,pcMesh_00), iVFormat == uVar3)) {
      puVar4 = num_refs + pcNode->mMeshes[(uint)pcMesh];
      if (*puVar4 == 0) {
        __assert_fail("0 != num_ref",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/PostProcessing/PretransformVertices.cpp"
                      ,0xa7,
                      "void Assimp::PretransformVertices::CollectData(aiScene *, aiNode *, unsigned int, unsigned int, aiMesh *, unsigned int *, unsigned int *)"
                     );
      }
      *puVar4 = *puVar4 - 1;
      if (*puVar4 == 0) {
        aiString::operator=(&pcMeshOut->mName,&pcMesh_00->mName);
      }
      if (bVar2) {
        memcpy(pcMeshOut->mVertices + *aiCurrent,pcMesh_00->mVertices,
               (ulong)pcMesh_00->mNumVertices * 0xc);
        if ((iVFormat & 2) != 0) {
          memcpy(pcMeshOut->mNormals + *aiCurrent,pcMesh_00->mNormals,
                 (ulong)pcMesh_00->mNumVertices * 0xc);
        }
        if ((iVFormat & 4) != 0) {
          memcpy(pcMeshOut->mTangents + *aiCurrent,pcMesh_00->mTangents,
                 (ulong)pcMesh_00->mNumVertices * 0xc);
          memcpy(pcMeshOut->mBitangents + *aiCurrent,pcMesh_00->mBitangents,
                 (ulong)pcMesh_00->mNumVertices * 0xc);
        }
      }
      else {
        for (local_4c = 0; local_4c < pcMesh_00->mNumVertices; local_4c = local_4c + 1) {
          aVar11 = ::operator*(&pcNode->mTransformation,pcMesh_00->mVertices + local_4c);
          mWorldIT._56_8_ = aVar11._0_8_;
          local_60 = aVar11.z;
          paVar5 = pcMeshOut->mVertices + (*aiCurrent + local_4c);
          paVar5->x = mWorldIT.d3;
          paVar5->y = mWorldIT.d4;
          paVar5->z = local_60;
        }
        memcpy(&m.c2,&pcNode->mTransformation,0x40);
        this_00 = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)&m.c2);
        aiMatrix4x4t<float>::Transpose(this_00);
        aiMatrix3x3t<float>::aiMatrix3x3t
                  ((aiMatrix3x3t<float> *)local_cc,(aiMatrix4x4t<float> *)&m.c2);
        if ((iVFormat & 2) != 0) {
          for (local_d0 = 0; local_d0 < pcMesh_00->mNumVertices; local_d0 = local_d0 + 1) {
            aVar11 = ::operator*((aiMatrix3x3t<float> *)local_cc,pcMesh_00->mNormals + local_d0);
            _fStack_f0 = aVar11._0_8_;
            local_dc.x = fStack_f0;
            local_dc.y = (float)n_2;
            local_e8 = aVar11.z;
            local_dc.z = local_e8;
            _fStack_f0 = aVar11;
            paVar6 = aiVector3t<float>::Normalize(&local_dc);
            paVar5 = pcMeshOut->mNormals + (*aiCurrent + local_d0);
            fVar1 = paVar6->y;
            paVar5->x = paVar6->x;
            paVar5->y = fVar1;
            paVar5->z = paVar6->z;
          }
        }
        if ((iVFormat & 4) != 0) {
          for (local_f4 = 0; local_f4 < pcMesh_00->mNumVertices; local_f4 = local_f4 + 1) {
            aVar11 = ::operator*((aiMatrix3x3t<float> *)local_cc,pcMesh_00->mTangents + local_f4);
            local_110.z = aVar11.z;
            local_100.z = local_110.z;
            local_110._0_8_ = aVar11._0_8_;
            local_100.x = local_110.x;
            local_100.y = local_110.y;
            local_110 = aVar11;
            paVar6 = aiVector3t<float>::Normalize(&local_100);
            paVar5 = pcMeshOut->mTangents;
            uVar3 = *aiCurrent;
            paVar5[uVar3 + local_f4].z = paVar6->z;
            fVar1 = paVar6->y;
            paVar5 = paVar5 + (uVar3 + local_f4);
            paVar5->x = paVar6->x;
            paVar5->y = fVar1;
            aVar11 = ::operator*((aiMatrix3x3t<float> *)local_cc,pcMesh_00->mBitangents + local_f4);
            _planck = aVar11._0_8_;
            local_11c.x = (float)planck;
            local_11c.y = (float)p;
            local_128 = aVar11.z;
            local_11c.z = local_128;
            paVar6 = aiVector3t<float>::Normalize(&local_11c);
            paVar5 = pcMeshOut->mBitangents + (*aiCurrent + local_f4);
            fVar1 = paVar6->y;
            paVar5->x = paVar6->x;
            paVar5->y = fVar1;
            paVar5->z = paVar6->z;
          }
        }
      }
      f_src._4_4_ = 0;
      while ((iVFormat & 0x100 << ((byte)f_src._4_4_ & 0x1f)) != 0) {
        memcpy(pcMeshOut->mTextureCoords[f_src._4_4_] + *aiCurrent,
               pcMesh_00->mTextureCoords[f_src._4_4_],(ulong)pcMesh_00->mNumVertices * 0xc);
        f_src._4_4_ = f_src._4_4_ + 1;
      }
      f_src._4_4_ = 0;
      while ((iVFormat & 0x1000000 << ((byte)f_src._4_4_ & 0x1f)) != 0) {
        memcpy(pcMeshOut->mColors[f_src._4_4_] + *aiCurrent,pcMesh_00->mColors[f_src._4_4_],
               (ulong)pcMesh_00->mNumVertices << 4);
        f_src._4_4_ = f_src._4_4_ + 1;
      }
      for (f_src._0_4_ = 0; (uint)f_src < pcMesh_00->mNumFaces; f_src._0_4_ = (uint)f_src + 1) {
        paVar7 = pcMesh_00->mFaces + (uint)f_src;
        paVar8 = pcMeshOut->mFaces + (aiCurrent[1] + (uint)f_src);
        uVar3 = paVar7->mNumIndices;
        paVar8->mNumIndices = uVar3;
        if (*puVar4 == 0) {
          puVar10 = paVar7->mIndices;
          paVar8->mIndices = puVar10;
          for (i_1 = 0; i_1 < uVar3; i_1 = i_1 + 1) {
            puVar10[i_1] = *aiCurrent + puVar10[i_1];
          }
        }
        else {
          uVar9 = SUB168(ZEXT416(uVar3) * ZEXT816(4),0);
          if (SUB168(ZEXT416(uVar3) * ZEXT816(4),8) != 0) {
            uVar9 = 0xffffffffffffffff;
          }
          puVar10 = (uint *)operator_new__(uVar9);
          paVar8->mIndices = puVar10;
          for (local_160 = 0; local_160 < uVar3; local_160 = local_160 + 1) {
            puVar10[local_160] = paVar7->mIndices[local_160] + *aiCurrent;
          }
        }
        uVar3 = pcMesh_00->mFaces[(uint)f_src].mNumIndices;
        if (uVar3 == 1) {
          pcMeshOut->mPrimitiveTypes = pcMeshOut->mPrimitiveTypes | 1;
        }
        else if (uVar3 == 2) {
          pcMeshOut->mPrimitiveTypes = pcMeshOut->mPrimitiveTypes | 2;
        }
        else if (uVar3 == 3) {
          pcMeshOut->mPrimitiveTypes = pcMeshOut->mPrimitiveTypes | 4;
        }
        else {
          pcMeshOut->mPrimitiveTypes = pcMeshOut->mPrimitiveTypes | 8;
        }
      }
      *aiCurrent = pcMesh_00->mNumVertices + *aiCurrent;
      aiCurrent[1] = pcMesh_00->mNumFaces + aiCurrent[1];
    }
    pcMesh._0_4_ = (uint)pcMesh + 1;
  } while( true );
}

Assistant:

void PretransformVertices::CollectData( aiScene* pcScene, aiNode* pcNode, unsigned int iMat,
    unsigned int iVFormat, aiMesh* pcMeshOut,
    unsigned int aiCurrent[2], unsigned int* num_refs)
{
    // No need to multiply if there's no transformation
    const bool identity = pcNode->mTransformation.IsIdentity();
    for (unsigned int i = 0; i < pcNode->mNumMeshes;++i)
    {
        aiMesh* pcMesh = pcScene->mMeshes[ pcNode->mMeshes[i] ];
        if (iMat == pcMesh->mMaterialIndex && iVFormat == GetMeshVFormat(pcMesh))
        {
            // Decrement mesh reference counter
            unsigned int& num_ref = num_refs[pcNode->mMeshes[i]];
            ai_assert(0 != num_ref);
            --num_ref;
            // Save the name of the last mesh
            if (num_ref==0)
            {
                pcMeshOut->mName = pcMesh->mName;
            }

            if (identity)   {
                // copy positions without modifying them
                ::memcpy(pcMeshOut->mVertices + aiCurrent[AI_PTVS_VERTEX],
                    pcMesh->mVertices,
                    pcMesh->mNumVertices * sizeof(aiVector3D));

                if (iVFormat & 0x2) {
                    // copy normals without modifying them
                    ::memcpy(pcMeshOut->mNormals + aiCurrent[AI_PTVS_VERTEX],
                        pcMesh->mNormals,
                        pcMesh->mNumVertices * sizeof(aiVector3D));
                }
                if (iVFormat & 0x4)
                {
                    // copy tangents without modifying them
                    ::memcpy(pcMeshOut->mTangents + aiCurrent[AI_PTVS_VERTEX],
                        pcMesh->mTangents,
                        pcMesh->mNumVertices * sizeof(aiVector3D));
                    // copy bitangents without modifying them
                    ::memcpy(pcMeshOut->mBitangents + aiCurrent[AI_PTVS_VERTEX],
                        pcMesh->mBitangents,
                        pcMesh->mNumVertices * sizeof(aiVector3D));
                }
            }
            else
            {
                // copy positions, transform them to worldspace
                for (unsigned int n = 0; n < pcMesh->mNumVertices;++n)  {
                    pcMeshOut->mVertices[aiCurrent[AI_PTVS_VERTEX]+n] = pcNode->mTransformation * pcMesh->mVertices[n];
                }
                aiMatrix4x4 mWorldIT = pcNode->mTransformation;
                mWorldIT.Inverse().Transpose();

                // TODO: implement Inverse() for aiMatrix3x3
                aiMatrix3x3 m = aiMatrix3x3(mWorldIT);

                if (iVFormat & 0x2)
                {
                    // copy normals, transform them to worldspace
                    for (unsigned int n = 0; n < pcMesh->mNumVertices;++n)  {
                        pcMeshOut->mNormals[aiCurrent[AI_PTVS_VERTEX]+n] =
                            (m * pcMesh->mNormals[n]).Normalize();
                    }
                }
                if (iVFormat & 0x4)
                {
                    // copy tangents and bitangents, transform them to worldspace
                    for (unsigned int n = 0; n < pcMesh->mNumVertices;++n)  {
                        pcMeshOut->mTangents  [aiCurrent[AI_PTVS_VERTEX]+n] = (m * pcMesh->mTangents[n]).Normalize();
                        pcMeshOut->mBitangents[aiCurrent[AI_PTVS_VERTEX]+n] = (m * pcMesh->mBitangents[n]).Normalize();
                    }
                }
            }
            unsigned int p = 0;
            while (iVFormat & (0x100 << p))
            {
                // copy texture coordinates
                memcpy(pcMeshOut->mTextureCoords[p] + aiCurrent[AI_PTVS_VERTEX],
                    pcMesh->mTextureCoords[p],
                    pcMesh->mNumVertices * sizeof(aiVector3D));
                ++p;
            }
            p = 0;
            while (iVFormat & (0x1000000 << p))
            {
                // copy vertex colors
                memcpy(pcMeshOut->mColors[p] + aiCurrent[AI_PTVS_VERTEX],
                    pcMesh->mColors[p],
                    pcMesh->mNumVertices * sizeof(aiColor4D));
                ++p;
            }
            // now we need to copy all faces. since we will delete the source mesh afterwards,
            // we don't need to reallocate the array of indices except if this mesh is
            // referenced multiple times.
            for (unsigned int planck = 0;planck < pcMesh->mNumFaces;++planck)
            {
                aiFace& f_src = pcMesh->mFaces[planck];
                aiFace& f_dst = pcMeshOut->mFaces[aiCurrent[AI_PTVS_FACE]+planck];

                const unsigned int num_idx = f_src.mNumIndices;

                f_dst.mNumIndices = num_idx;

                unsigned int* pi;
                if (!num_ref) { /* if last time the mesh is referenced -> no reallocation */
                    pi = f_dst.mIndices = f_src.mIndices;

                    // offset all vertex indices
                    for (unsigned int hahn = 0; hahn < num_idx;++hahn){
                        pi[hahn] += aiCurrent[AI_PTVS_VERTEX];
                    }
                }
                else {
                    pi = f_dst.mIndices = new unsigned int[num_idx];

                    // copy and offset all vertex indices
                    for (unsigned int hahn = 0; hahn < num_idx;++hahn){
                        pi[hahn] = f_src.mIndices[hahn] + aiCurrent[AI_PTVS_VERTEX];
                    }
                }

                // Update the mPrimitiveTypes member of the mesh
                switch (pcMesh->mFaces[planck].mNumIndices)
                {
                case 0x1:
                    pcMeshOut->mPrimitiveTypes |= aiPrimitiveType_POINT;
                    break;
                case 0x2:
                    pcMeshOut->mPrimitiveTypes |= aiPrimitiveType_LINE;
                    break;
                case 0x3:
                    pcMeshOut->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
                    break;
                default:
                    pcMeshOut->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
                    break;
                };
            }
            aiCurrent[AI_PTVS_VERTEX] += pcMesh->mNumVertices;
            aiCurrent[AI_PTVS_FACE]   += pcMesh->mNumFaces;
        }
    }

    // append all children of us
    for (unsigned int i = 0;i < pcNode->mNumChildren;++i) {
        CollectData(pcScene,pcNode->mChildren[i],iMat,
            iVFormat,pcMeshOut,aiCurrent,num_refs);
    }
}